

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQInstance *i,SQInteger memsize)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  uint uVar3;
  SQClass *pSVar4;
  SQUnsignedInteger SVar5;
  long lVar6;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = 0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQInstance_0013ff20;
  this->_values[0].super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_values[0].super_SQObject._type = OT_NULL;
  this->_memsize = memsize;
  pSVar4 = i->_class;
  this->_class = pSVar4;
  SVar5 = (pSVar4->_defaultvalues)._size;
  if (SVar5 != 0) {
    lVar6 = 0x60;
    do {
      uVar3 = *(uint *)((long)(i->_values + -6) + lVar6);
      *(uint *)((long)(this->_values + -6) + lVar6) = uVar3;
      *(undefined8 *)((long)this->_values + lVar6 + -0x58) =
           *(undefined8 *)((long)i->_values + lVar6 + -0x58);
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(*(long *)((long)this->_values + lVar6 + -0x58) + 8);
        *plVar1 = *plVar1 + 1;
      }
      lVar6 = lVar6 + 0x10;
      SVar5 = SVar5 - 1;
    } while (SVar5 != 0);
  }
  this->_userpointer = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  pSVar2 = &(pSVar4->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar2 = *pSVar2 + 1;
  (this->super_SQDelegable)._delegate = pSVar4->_members;
  (this->super_SQDelegable).super_SQCollectable._next = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._prev = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQInstance *i, SQInteger memsize)
{
    _memsize = memsize;
    _class = i->_class;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(i->_values[n]);
    }
    Init(ss);
}